

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuPixelFormat.hpp
# Opt level: O0

RGBA __thiscall tcu::PixelFormat::convertColor(PixelFormat *this,RGBA *col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int val;
  int local_3c;
  RGBA *col_local;
  PixelFormat *this_local;
  
  iVar1 = RGBA::getRed(col);
  iVar1 = convertChannel(iVar1,this->redBits);
  iVar2 = RGBA::getGreen(col);
  iVar2 = convertChannel(iVar2,this->greenBits);
  iVar3 = RGBA::getBlue(col);
  iVar3 = convertChannel(iVar3,this->blueBits);
  if (this->alphaBits == 0) {
    local_3c = 0xff;
  }
  else {
    val = RGBA::getAlpha(col);
    local_3c = convertChannel(val,this->alphaBits);
  }
  RGBA::RGBA((RGBA *)((long)&this_local + 4),iVar1,iVar2,iVar3,local_3c);
  return (RGBA)this_local._4_4_;
}

Assistant:

inline RGBA convertColor (const RGBA& col) const
	{
		return RGBA(convertChannel(col.getRed(),	redBits),
					convertChannel(col.getGreen(),	greenBits),
					convertChannel(col.getBlue(),	blueBits),
					alphaBits ? convertChannel(col.getAlpha(), alphaBits) : 0xff);
	}